

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_surjectionproof_verify
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,
              secp256k1_generator *ephemeral_input_tags,size_t n_ephemeral_input_tags,
              secp256k1_generator *ephemeral_output_tag)

{
  int iVar1;
  size_t n_input_tags;
  size_t n_pubkeys;
  int local_a07c;
  uchar local_a078 [4];
  int overflow;
  uchar msg32 [32];
  secp256k1_scalar borromean_s [256];
  secp256k1_gej ring_pubkeys [256];
  size_t n_used_pubkeys;
  size_t n_total_pubkeys;
  size_t i;
  size_t rsizes [1];
  secp256k1_generator *ephemeral_output_tag_local;
  size_t n_ephemeral_input_tags_local;
  secp256k1_generator *ephemeral_input_tags_local;
  secp256k1_surjectionproof *proof_local;
  secp256k1_context *ctx_local;
  
  rsizes[0] = (size_t)ephemeral_output_tag;
  iVar1 = secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)");
    ctx_local._4_4_ = 0;
  }
  else if (proof == (secp256k1_surjectionproof *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"proof != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (ephemeral_input_tags == (secp256k1_generator *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"ephemeral_input_tags != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (rsizes[0] == 0) {
    secp256k1_callback_call(&ctx->illegal_callback,"ephemeral_output_tag != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    n_input_tags = secp256k1_surjectionproof_n_total_inputs(ctx,proof);
    n_pubkeys = secp256k1_surjectionproof_n_used_inputs(ctx,proof);
    if (((n_pubkeys == 0) || (n_input_tags < n_pubkeys)) || (n_input_tags != n_ephemeral_input_tags)
       ) {
      ctx_local._4_4_ = 0;
    }
    else if (n_pubkeys < 0x101) {
      iVar1 = secp256k1_surjection_compute_public_keys
                        ((secp256k1_gej *)(borromean_s[0xff].d + 3),n_pubkeys,ephemeral_input_tags,
                         n_input_tags,proof->used_inputs,(secp256k1_generator *)rsizes[0],0,
                         (size_t *)0x0);
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        i = (size_t)(int)n_pubkeys;
        for (n_total_pubkeys = 0; n_total_pubkeys < n_pubkeys; n_total_pubkeys = n_total_pubkeys + 1
            ) {
          local_a07c = 0;
          secp256k1_scalar_set_b32
                    ((secp256k1_scalar *)(borromean_s[n_total_pubkeys - 1].d + 3),
                     proof->data + n_total_pubkeys * 0x20 + 0x20,&local_a07c);
          if (local_a07c == 1) {
            return 0;
          }
        }
        secp256k1_surjection_genmessage
                  (local_a078,ephemeral_input_tags,n_input_tags,(secp256k1_generator *)rsizes[0]);
        ctx_local._4_4_ =
             secp256k1_borromean_verify
                       (&ctx->ecmult_ctx,(secp256k1_scalar *)0x0,proof->data,
                        (secp256k1_scalar *)(msg32 + 0x18),
                        (secp256k1_gej *)(borromean_s[0xff].d + 3),&i,1,local_a078,0x20);
      }
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_surjectionproof_verify(const secp256k1_context* ctx, const secp256k1_surjectionproof* proof, const secp256k1_generator* ephemeral_input_tags, size_t n_ephemeral_input_tags, const secp256k1_generator* ephemeral_output_tag) {
    size_t rsizes[1];    /* array needed for borromean sig API */
    size_t i;
    size_t n_total_pubkeys;
    size_t n_used_pubkeys;
    secp256k1_gej ring_pubkeys[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    secp256k1_scalar borromean_s[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    unsigned char msg32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(proof != NULL);
    ARG_CHECK(ephemeral_input_tags != NULL);
    ARG_CHECK(ephemeral_output_tag != NULL);

    /* Compute public keys */
    n_total_pubkeys = secp256k1_surjectionproof_n_total_inputs(ctx, proof);
    n_used_pubkeys = secp256k1_surjectionproof_n_used_inputs(ctx, proof);
    if (n_used_pubkeys == 0 || n_used_pubkeys > n_total_pubkeys || n_total_pubkeys != n_ephemeral_input_tags) {
        return 0;
    }

    /* Reject proofs with too many used inputs in USE_REDUCED_SURJECTION_PROOF_SIZE mode */
    if (n_used_pubkeys > SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS) {
        return 0;
    }

    if (secp256k1_surjection_compute_public_keys(ring_pubkeys, n_used_pubkeys, ephemeral_input_tags, n_total_pubkeys, proof->used_inputs, ephemeral_output_tag, 0, NULL) == 0) {
        return 0;
    }

    /* Verify signature */
    rsizes[0] = (int) n_used_pubkeys;
    for (i = 0; i < n_used_pubkeys; i++) {
        int overflow = 0;
        secp256k1_scalar_set_b32(&borromean_s[i], &proof->data[32 + 32 * i], &overflow);
        if (overflow == 1) {
            return 0;
        }
    }
    secp256k1_surjection_genmessage(msg32, ephemeral_input_tags, n_total_pubkeys, ephemeral_output_tag);
    return secp256k1_borromean_verify(&ctx->ecmult_ctx, NULL, &proof->data[0], borromean_s, ring_pubkeys, rsizes, 1, msg32, 32);
}